

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O3

void __thiscall Kernel::Signature::~Signature(Signature *this)

{
  Unit **ppUVar1;
  Symbol **ppSVar2;
  TermList *pTVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = (ulong)((long)(this->_funs)._cursor - (long)(this->_funs)._stack) >> 3 & 0xffffffff;
  while( true ) {
    uVar5 = uVar5 - 1;
    if ((int)(uint)uVar5 < 0) break;
    Symbol::destroyFnSymbol((this->_funs)._stack[(uint)uVar5 & 0x7fffffff]);
  }
  uVar4 = (int)((ulong)((long)(this->_preds)._cursor - (long)(this->_preds)._stack) >> 3) - 1;
  if (-1 < (int)uVar4) {
    uVar5 = (ulong)uVar4;
    do {
      Symbol::destroyPredSymbol((this->_preds)._stack[uVar5]);
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar6);
  }
  uVar4 = (int)((ulong)((long)(this->_typeCons)._cursor - (long)(this->_typeCons)._stack) >> 3) - 1;
  if (-1 < (int)uVar4) {
    uVar5 = (ulong)uVar4;
    do {
      Symbol::destroyTypeConSymbol((this->_typeCons)._stack[uVar5]);
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar6);
  }
  Lib::DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_termAlgebras);
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_boolDefPreds);
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&(this->_fnDefPreds)._map);
  Lib::
  DHMap<std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_iSymbols);
  Lib::Stack<Lib::SmartPtr<Lib::Stack<unsigned_int>_>_>::~Stack(&this->_distinctGroupMembers);
  ppUVar1 = (this->_distinctGroupPremises)._stack;
  if (ppUVar1 != (Unit **)0x0) {
    uVar5 = (this->_distinctGroupPremises)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      *ppUVar1 = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppUVar1;
    }
    else if (uVar5 < 0x11) {
      *ppUVar1 = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppUVar1;
    }
    else if (uVar5 < 0x19) {
      *ppUVar1 = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppUVar1;
    }
    else if (uVar5 < 0x21) {
      *ppUVar1 = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppUVar1;
    }
    else if (uVar5 < 0x31) {
      *ppUVar1 = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppUVar1;
    }
    else if (uVar5 < 0x41) {
      *ppUVar1 = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppUVar1;
    }
    else {
      operator_delete(ppUVar1,0x10);
    }
  }
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_varNames);
  Lib::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_arityCheck);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_typeConNames);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_predNames);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_funNames);
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&(this->_choiceSymbols)._map);
  ppSVar2 = (this->_typeCons)._stack;
  if (ppSVar2 != (Symbol **)0x0) {
    uVar5 = (this->_typeCons)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppSVar2;
    }
    else if (uVar5 < 0x11) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppSVar2;
    }
    else if (uVar5 < 0x19) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppSVar2;
    }
    else if (uVar5 < 0x21) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppSVar2;
    }
    else if (uVar5 < 0x31) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppSVar2;
    }
    else if (uVar5 < 0x41) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppSVar2;
    }
    else {
      operator_delete(ppSVar2,0x10);
    }
  }
  ppSVar2 = (this->_preds)._stack;
  if (ppSVar2 != (Symbol **)0x0) {
    uVar5 = (this->_preds)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppSVar2;
    }
    else if (uVar5 < 0x11) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppSVar2;
    }
    else if (uVar5 < 0x19) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppSVar2;
    }
    else if (uVar5 < 0x21) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppSVar2;
    }
    else if (uVar5 < 0x31) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppSVar2;
    }
    else if (uVar5 < 0x41) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppSVar2;
    }
    else {
      operator_delete(ppSVar2,0x10);
    }
  }
  ppSVar2 = (this->_funs)._stack;
  if (ppSVar2 != (Symbol **)0x0) {
    uVar5 = (this->_funs)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppSVar2;
    }
    else if (uVar5 < 0x11) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppSVar2;
    }
    else if (uVar5 < 0x19) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppSVar2;
    }
    else if (uVar5 < 0x21) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppSVar2;
    }
    else if (uVar5 < 0x31) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppSVar2;
    }
    else if (uVar5 < 0x41) {
      *ppSVar2 = (Symbol *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppSVar2;
    }
    else {
      operator_delete(ppSVar2,0x10);
    }
  }
  Lib::DHMap<Kernel::Term_*,_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_formulaCounts);
  pTVar3 = (this->_dividesNvalues)._stack;
  if (pTVar3 != (TermList *)0x0) {
    uVar5 = (this->_dividesNvalues)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      pTVar3->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pTVar3;
    }
    else if (uVar5 < 0x11) {
      pTVar3->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pTVar3;
    }
    else if (uVar5 < 0x19) {
      pTVar3->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pTVar3;
    }
    else if (uVar5 < 0x21) {
      pTVar3->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pTVar3;
    }
    else if (uVar5 < 0x31) {
      pTVar3->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pTVar3;
    }
    else {
      if (0x40 < uVar5) {
        operator_delete(pTVar3,0x10);
        return;
      }
      pTVar3->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pTVar3;
    }
  }
  return;
}

Assistant:

Signature::~Signature ()
{
  for (int i = _funs.length()-1;i >= 0;i--) {
    _funs[i]->destroyFnSymbol();
  }
  for (int i = _preds.length()-1;i >= 0;i--) {
    _preds[i]->destroyPredSymbol();
  }
  for (int i = _typeCons.length()-1;i >= 0;i--) {
    _typeCons[i]->destroyTypeConSymbol();
  }
}